

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O2

int lua_gc(lua_State *L,int what,int data)

{
  undefined4 uVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  global_State *g;
  ulong uVar5;
  
  if (7 < (uint)what) {
    return -1;
  }
  uVar4 = (L->glref).ptr32;
  uVar5 = (ulong)uVar4;
  switch(what) {
  case 0:
    *(undefined4 *)(uVar5 + 0x24) = 0x7fffff00;
    goto LAB_0010fb16;
  case 1:
    uVar4 = *(uint *)(uVar5 + 0x20);
    if (data == -1) {
      uVar4 = (uVar4 / 100) * *(int *)(uVar5 + 0x54);
    }
    *(uint *)(uVar5 + 0x24) = uVar4;
LAB_0010fb16:
    uVar4 = 0;
    break;
  case 2:
    uVar1 = *(undefined4 *)(uVar5 + 0xe8);
    *(undefined4 *)(uVar5 + 0xe8) = 0xfffffffd;
    bVar2 = *(byte *)(uVar5 + 0x29);
    if (bVar2 < 3) {
      *(uint *)(uVar5 + 0x34) = uVar4 + 0x30;
      *(undefined8 *)(uVar5 + 0x38) = 0;
      *(undefined4 *)(uVar5 + 0x40) = 0;
      *(undefined1 *)(uVar5 + 0x29) = 3;
      *(undefined4 *)(uVar5 + 0x2c) = 0;
      bVar2 = 3;
    }
    while ((byte)(bVar2 - 3) < 2) {
      gc_onestep(L);
      bVar2 = *(byte *)(uVar5 + 0x29);
    }
    *(undefined1 *)(uVar5 + 0x29) = 0;
    do {
      gc_onestep(L);
    } while (*(char *)(uVar5 + 0x29) != '\0');
    uVar4 = 0;
    *(uint *)(uVar5 + 0x24) = (*(uint *)(uVar5 + 0x50) / 100) * *(int *)(uVar5 + 0x54);
    *(undefined4 *)(uVar5 + 0xe8) = uVar1;
    break;
  case 3:
    uVar4 = *(uint *)(uVar5 + 0x20) >> 10;
    break;
  case 4:
    uVar4 = *(uint *)(uVar5 + 0x20) & 0x3ff;
    break;
  case 5:
    iVar3 = *(uint *)(uVar5 + 0x20) + data * -0x400;
    if (*(uint *)(uVar5 + 0x20) < (uint)(data * 0x400)) {
      iVar3 = 0;
    }
    *(int *)(uVar5 + 0x24) = iVar3;
    do {
      if (*(uint *)(uVar5 + 0x20) < *(uint *)(uVar5 + 0x24)) {
        return 0;
      }
      iVar3 = lj_gc_step(L);
    } while (iVar3 < 1);
    uVar4 = 1;
    break;
  case 6:
    uVar4 = *(uint *)(uVar5 + 0x54);
    *(int *)(uVar5 + 0x54) = data;
    break;
  case 7:
    uVar4 = *(uint *)(uVar5 + 0x48);
    *(int *)(uVar5 + 0x48) = data;
  }
  return uVar4;
}

Assistant:

LUA_API int lua_gc(lua_State *L, int what, int data)
{
  global_State *g = G(L);
  int res = 0;
  switch (what) {
  case LUA_GCSTOP:
    g->gc.threshold = LJ_MAX_MEM;
    break;
  case LUA_GCRESTART:
    g->gc.threshold = data == -1 ? (g->gc.total/100)*g->gc.pause : g->gc.total;
    break;
  case LUA_GCCOLLECT:
    lj_gc_fullgc(L);
    break;
  case LUA_GCCOUNT:
    res = (int)(g->gc.total >> 10);
    break;
  case LUA_GCCOUNTB:
    res = (int)(g->gc.total & 0x3ff);
    break;
  case LUA_GCSTEP: {
    MSize a = (MSize)data << 10;
    g->gc.threshold = (a <= g->gc.total) ? (g->gc.total - a) : 0;
    while (g->gc.total >= g->gc.threshold)
      if (lj_gc_step(L) > 0) {
	res = 1;
	break;
      }
    break;
  }
  case LUA_GCSETPAUSE:
    res = (int)(g->gc.pause);
    g->gc.pause = (MSize)data;
    break;
  case LUA_GCSETSTEPMUL:
    res = (int)(g->gc.stepmul);
    g->gc.stepmul = (MSize)data;
    break;
  default:
    res = -1;  /* Invalid option. */
  }
  return res;
}